

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Syntax SVar5;
  FileDescriptor *pFVar6;
  char *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  Message *unaff_retaddr;
  string *in_stack_00000008;
  DescriptorBuilder *in_stack_00000010;
  EnumDescriptorProto *in_stack_00000090;
  EnumDescriptor *in_stack_00000098;
  DescriptorBuilder *in_stack_000000a0;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *in_stack_00000220;
  Descriptor *in_stack_00000228;
  DescriptorBuilder *in_stack_00000230;
  undefined8 in_stack_ffffffffffffff18;
  FileDescriptorProto *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ServiceDescriptor *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff60;
  FieldDescriptor *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [36];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  ErrorLocation location;
  
  local_1c = 0;
  local_18 = in_RDX;
  while (iVar7 = local_1c, iVar2 = FileDescriptor::message_type_count((FileDescriptor *)in_RSI),
        iVar7 < iVar2) {
    in_stack_ffffffffffffff68 =
         (FieldDescriptor *)(in_RSI[3]._M_string_length + (long)local_1c * 0x90);
    FileDescriptorProto::message_type
              (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ValidateMessageOptions(in_stack_00000230,in_stack_00000228,in_stack_00000220);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while (iVar2 = local_20, iVar3 = FileDescriptor::enum_type_count((FileDescriptor *)in_RSI),
        iVar2 < iVar3) {
    FileDescriptorProto::enum_type
              (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ValidateEnumOptions(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    local_20 = local_20 + 1;
  }
  for (local_24 = 0; iVar3 = local_24,
      iVar4 = FileDescriptor::service_count((FileDescriptor *)in_RSI), iVar3 < iVar4;
      local_24 = local_24 + 1) {
    FileDescriptorProto::service
              (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ValidateServiceOptions
              ((DescriptorBuilder *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,
               (ServiceDescriptorProto *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  local_28 = 0;
  while (iVar3 = local_28, iVar4 = FileDescriptor::extension_count((FileDescriptor *)in_RSI),
        iVar3 < iVar4) {
    FileDescriptorProto::extension
              (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ValidateFieldOptions
              ((DescriptorBuilder *)CONCAT44(iVar7,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,
               (FieldDescriptorProto *)CONCAT44(iVar2,in_stack_ffffffffffffff60));
    local_28 = local_28 + 1;
  }
  bVar1 = IsLite((FileDescriptor *)in_stack_ffffffffffffff20);
  if (!bVar1) {
    local_2c = 0;
    while (iVar3 = local_2c, iVar4 = FileDescriptor::dependency_count((FileDescriptor *)in_RSI),
          iVar3 < iVar4) {
      FileDescriptor::dependency
                ((FileDescriptor *)CONCAT44(iVar3,in_stack_ffffffffffffff30),
                 (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      bVar1 = IsLite((FileDescriptor *)in_stack_ffffffffffffff20);
      iVar4 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      location = (ErrorLocation)((ulong)in_RDI >> 0x20);
      if (bVar1) {
        pFVar6 = FileDescriptor::dependency
                           ((FileDescriptor *)CONCAT44(iVar3,in_stack_ffffffffffffff30),iVar4);
        FileDescriptor::name_abi_cxx11_(pFVar6);
        pFVar6 = FileDescriptor::dependency
                           ((FileDescriptor *)CONCAT44(iVar3,in_stack_ffffffffffffff30),iVar4);
        FileDescriptor::name_abi_cxx11_(pFVar6);
        __lhs = &local_70;
        std::operator+((char *)in_stack_ffffffffffffff68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar2,in_stack_ffffffffffffff60));
        std::operator+(__lhs,local_18);
        AddError(in_stack_00000010,in_stack_00000008,unaff_retaddr,location,in_RSI);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string((string *)&local_70);
        break;
      }
      local_2c = local_2c + 1;
    }
  }
  SVar5 = FileDescriptor::syntax((FileDescriptor *)in_RSI);
  if (SVar5 == SYNTAX_PROTO3) {
    ValidateProto3((DescriptorBuilder *)CONCAT44(iVar7,in_stack_ffffffffffffff70),
                   (FileDescriptor *)in_stack_ffffffffffffff68,
                   (FileDescriptorProto *)CONCAT44(iVar2,in_stack_ffffffffffffff60));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
            file->dependency(i)->name(), proto,
            DescriptorPool::ErrorCollector::IMPORT,
            "Files that do not use optimize_for = LITE_RUNTIME cannot import "
            "files which do use this option.  This file is not lite, but it "
            "imports \"" +
                file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
  if (file->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    ValidateProto3(file, proto);
  }
}